

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddAsmJsConstantTable
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  uint32 uVar5;
  Type *pTVar6;
  AsmJsFunctionInfo *this_00;
  TypedSlotInfo *pTVar7;
  undefined4 *puVar8;
  uint local_5c;
  Type *pTStack_58;
  uint32 reg;
  byte *byteTable;
  uint32 typeSize;
  uint32 constCount;
  TypedSlotInfo *typedInfo;
  Types type;
  int i;
  byte *tableEnd;
  Type *constTable;
  uint32 size;
  FunctionBody *function_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  pTVar6 = FunctionBody::GetConstTable(function);
  RVar4 = FunctionBody::GetConstantCount(function);
  typedInfo._4_4_ = INT32;
  do {
    if (4 < (int)typedInfo._4_4_) {
      return 0;
    }
    this_00 = FunctionBody::GetAsmJsFunctionInfo(function);
    pTVar7 = AsmJsFunctionInfo::GetTypedSlotInfo(this_00,typedInfo._4_4_);
    uVar1 = pTVar7->constCount;
    if (1 < uVar1) {
      uVar5 = WAsmJs::GetTypeByteSize(typedInfo._4_4_);
      pTStack_58 = (Type *)((long)&pTVar6->ptr + (ulong)uVar5 + (ulong)pTVar7->constSrcByteOffset);
      for (local_5c = 1; local_5c < uVar1; local_5c = local_5c + 1) {
        if (typedInfo._4_4_ == INT32) {
          PrependConstantInt32
                    (this,builder,L"Integer Constant Value",*(int *)&pTStack_58->ptr,
                     (ConstantSizedBufferBuilderOf<int> **)0x0);
        }
        else if (typedInfo._4_4_ == FLOAT32) {
          PrependFloat(this,builder,L"Float Constant Value",*(float *)&pTStack_58->ptr);
        }
        else {
          if (typedInfo._4_4_ != FLOAT64) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                        ,0x651,"((0))","UNREACHED");
            if (bVar3) {
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
              Throw::FatalInternalError(-0x7fffbffb);
            }
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          PrependDouble(this,builder,L"Double Constant Value",(double)pTStack_58->ptr);
        }
        pTStack_58 = (Type *)((long)&pTStack_58->ptr + (ulong)uVar5);
      }
      if (pTVar6 + RVar4 < pTStack_58) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x65a,"((0))","UNREACHED");
        if (bVar3) {
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
          Throw::FatalInternalError(-0x7fffbffb);
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    typedInfo._4_4_ = typedInfo._4_4_ + INT64;
  } while( true );
}

Assistant:

uint32 AddAsmJsConstantTable(BufferBuilderList & builder, FunctionBody * function)
    {
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start Constant Table"), magicStartOfConstantTable);
#endif

        auto constTable = function->GetConstTable();
        byte* tableEnd = (byte*)(constTable + function->GetConstantCount());

        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            WAsmJs::Types type = (WAsmJs::Types)i;
            WAsmJs::TypedSlotInfo* typedInfo = function->GetAsmJsFunctionInfo()->GetTypedSlotInfo(type);
            uint32 constCount = typedInfo->constCount;
            if (constCount > FunctionBody::FirstRegSlot)
            {
                uint32 typeSize = WAsmJs::GetTypeByteSize(type);
                byte* byteTable = ((byte*)constTable) + typedInfo->constSrcByteOffset;
                byteTable += typeSize * FunctionBody::FirstRegSlot;
                for (uint32 reg = FunctionBody::FirstRegSlot; reg < constCount; ++reg)
                {
                    switch (type)
                    {
                    case WAsmJs::INT32:   PrependConstantInt32(builder, _u("Integer Constant Value"), *(int*)byteTable); break;
                    case WAsmJs::FLOAT32: PrependFloat(builder, _u("Float Constant Value"), *(float*)byteTable); break;
                    case WAsmJs::FLOAT64: PrependDouble(builder, _u("Double Constant Value"), *(double*)byteTable); break;
                    default:
                        Assert(UNREACHED);
                        Js::Throw::FatalInternalError();
                        break;
                    }
                    byteTable += typeSize;
                }

                if (byteTable > tableEnd)
                {
                    Assert(UNREACHED);
                    Js::Throw::FatalInternalError();
                }
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End Constant Table"), magicEndOfConstantTable);
#endif

        return size;
    }